

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::
makeArrayFill<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,Index pos)

{
  __index_type *__return_storage_ptr___00;
  HeapType *pHVar1;
  bool bVar2;
  Ok local_ad;
  uint local_ac;
  Err local_a8;
  Err *local_88;
  Err *err;
  undefined1 local_70 [8];
  Result<wasm::HeapType> _val;
  Result<wasm::HeapType> type;
  Index pos_local;
  ParseModuleTypesCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20);
  typeidx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
            ((Result<wasm::HeapType> *)__return_storage_ptr___00,ctx);
  Result<wasm::HeapType>::Result
            ((Result<wasm::HeapType> *)local_70,(Result<wasm::HeapType> *)__return_storage_ptr___00)
  ;
  local_88 = Result<wasm::HeapType>::getErr((Result<wasm::HeapType> *)local_70);
  bVar2 = local_88 != (Err *)0x0;
  if (bVar2) {
    WATParser::Err::Err(&local_a8,local_88);
    Result<wasm::WATParser::Ok>::Result(__return_storage_ptr__,&local_a8);
    WATParser::Err::~Err(&local_a8);
  }
  local_ac = (uint)bVar2;
  Result<wasm::HeapType>::~Result((Result<wasm::HeapType> *)local_70);
  if (local_ac == 0) {
    pHVar1 = Result<wasm::HeapType>::operator*
                       ((Result<wasm::HeapType> *)
                        ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                                super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                                super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20)
                       );
    NullInstrParserCtx::makeArrayFill<wasm::HeapType>
              ((NullInstrParserCtx *)ctx,pos,(HeapType)pHVar1->id);
    Result<wasm::WATParser::Ok>::Result<wasm::WATParser::Ok>(__return_storage_ptr__,&local_ad);
    local_ac = 1;
  }
  Result<wasm::HeapType>::~Result
            ((Result<wasm::HeapType> *)
             ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::InstrT> makeArrayFill(Ctx& ctx, Index pos) {
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  return ctx.makeArrayFill(pos, *type);
}